

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge_detection.cpp
# Opt level: O3

bool anon_unknown.dwarf_8c247::findPoint<float>
               (vector<int,_std::allocator<int>_> *data,vector<int,_std::allocator<int>_> *second,
               vector<float,_std::allocator<float>_> *edge,uint32_t leftSideOffset,
               uint32_t rightSideOffset,int minimumContrast,bool checkContrast,
               uint32_t leftSideContrastCheck,uint32_t rightSideContrastCheck,uint32_t position,
               uint32_t size)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __result;
  int *piVar4;
  float *__args;
  int iVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  iterator __position;
  int iVar9;
  int *piVar10;
  long lVar11;
  ulong uVar12;
  int *piVar13;
  int *piVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 in_ZMM3 [64];
  undefined4 in_XMM4_Da;
  undefined1 in_register_00001304 [12];
  float local_30;
  float local_2c;
  
  uVar12 = (ulong)leftSideOffset;
  piVar4 = (int *)((long)&(data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start + uVar12 * 4);
  iVar5 = *piVar4;
  iVar9 = iVar5;
  if (leftSideOffset != rightSideOffset &&
      piVar4 != (int *)((long)&(data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start + (ulong)rightSideOffset * 4 + 4)) {
    piVar10 = (int *)((long)&(data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start + uVar12 * 4 + 4);
    lVar11 = (ulong)rightSideOffset * 4;
    lVar7 = lVar11 + uVar12 * -4;
    piVar13 = piVar4;
    piVar14 = piVar10;
    do {
      iVar1 = *piVar14;
      iVar8 = iVar9;
      if (iVar9 <= iVar1) {
        iVar8 = iVar1;
      }
      if (iVar9 < iVar1) {
        piVar13 = piVar14;
      }
      piVar14 = piVar14 + 1;
      lVar7 = lVar7 + -4;
      iVar9 = iVar8;
    } while (lVar7 != 0);
    iVar9 = *piVar13;
    lVar11 = lVar11 + uVar12 * -4;
    do {
      if (*piVar10 < iVar5) {
        piVar4 = piVar10;
        iVar5 = *piVar10;
      }
      piVar10 = piVar10 + 1;
      lVar11 = lVar11 + -4;
    } while (lVar11 != 0);
  }
  if (iVar9 - *piVar4 < minimumContrast) {
    return false;
  }
  if ((checkContrast && leftSideContrastCheck <= position) &&
     (uVar6 = position + rightSideContrastCheck, uVar6 < size)) {
    fVar15 = 0.0;
    fVar16 = 0.0;
    fVar17 = 0.0;
    if ((long)&(data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_start + (ulong)(position - leftSideContrastCheck) * 4 !=
        (long)&(data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_start + (ulong)position * 4 + 4) {
      lVar7 = (ulong)(position - leftSideContrastCheck) << 2;
      do {
        piVar4 = (int *)((long)&(data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start + lVar7);
        lVar7 = lVar7 + 4;
        fVar16 = fVar16 + (float)*piVar4;
        fVar17 = fVar16;
      } while ((ulong)position * 4 + 4 != lVar7);
    }
    uVar12 = (ulong)(position + 1);
    if ((long)&(data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_start + uVar12 * 4 !=
        (long)&(data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_start + (ulong)uVar6 * 4 + 4) {
      lVar7 = uVar12 * 4;
      fVar15 = 0.0;
      do {
        piVar4 = (int *)((long)&(data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start + lVar7);
        lVar7 = lVar7 + 4;
        fVar15 = fVar15 + (float)*piVar4;
      } while ((ulong)uVar6 * 4 + 4 != lVar7);
    }
    auVar2 = vcvtusi2ss_avx512f(in_ZMM3._0_16_,rightSideContrastCheck);
    auVar3._4_12_ = in_register_00001304;
    auVar3._0_4_ = in_XMM4_Da;
    auVar3 = vcvtusi2ss_avx512f(auVar3,leftSideContrastCheck + 1);
    if (fVar15 / auVar2._0_4_ - fVar17 / auVar3._0_4_ < (float)minimumContrast) {
      return false;
    }
  }
  else {
    if (checkContrast) {
      return false;
    }
    uVar12 = (ulong)(position + 1);
  }
  iVar5 = *(int *)((long)&(second->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start + (ulong)position * 4);
  auVar2._4_12_ = in_register_00001304;
  auVar2._0_4_ = in_XMM4_Da;
  auVar2 = vcvtusi2ss_avx512f(auVar2,position);
  iVar9 = iVar5 - *(int *)((long)&(second->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_start + uVar12 * 4);
  if (iVar9 == 0) {
    fVar16 = auVar2._0_4_ + 0.5;
    __position._M_current =
         (edge->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (__position._M_current ==
        (edge->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      __args = &local_30;
      local_30 = fVar16;
LAB_0011b3cc:
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(edge,__position,__args);
      return true;
    }
  }
  else {
    fVar16 = (float)iVar5 / (float)iVar9 + auVar2._0_4_;
    __position._M_current =
         (edge->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (__position._M_current ==
        (edge->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      __args = &local_2c;
      local_2c = fVar16;
      goto LAB_0011b3cc;
    }
  }
  *__position._M_current = fVar16;
  (edge->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
  _M_finish = __position._M_current + 1;
  return true;
}

Assistant:

bool findPoint( const std::vector< int > & data, const std::vector< int > & second, std::vector< _Type > & edge,
                    uint32_t leftSideOffset, uint32_t rightSideOffset, int minimumContrast, bool checkContrast,
                    uint32_t leftSideContrastCheck, uint32_t rightSideContrastCheck, uint32_t position, uint32_t size )
    {
        const int maxIntensity = *(std::max_element( data.begin() + leftSideOffset, data.begin() + rightSideOffset + 1 ));
        const int minIntensity = *(std::min_element( data.begin() + leftSideOffset, data.begin() + rightSideOffset + 1 ));

        if ( maxIntensity - minIntensity < minimumContrast )
            return false;

        if ( checkContrast && leftSideContrastCheck <= position && (rightSideContrastCheck + position) < size ) {
            const uint32_t blackContrastEnd   = position;
            const uint32_t whiteContrastStart = position + 1;

            const uint32_t blackContrastStart = position - leftSideContrastCheck;
            const uint32_t whiteContrastEnd   = position + rightSideContrastCheck;

            _Type sumBlack = std::accumulate( data.begin() + blackContrastStart, data.begin() + blackContrastEnd + 1, 0.0f );
            _Type sumWhite = std::accumulate( data.begin() + whiteContrastStart, data.begin() + whiteContrastEnd + 1, 0.0f );

            sumBlack /= (blackContrastEnd - blackContrastStart + 1);
            sumWhite /= (whiteContrastEnd - whiteContrastStart + 1);

            if ( sumWhite - sumBlack >= minimumContrast )
                checkContrast = false;
        }

        if ( !checkContrast ) {
            if ( second[position] != second[position + 1] )
                edge.push_back( position + static_cast<_Type>(second[position]) / (second[position] - second[position + 1u]) );
            else
                edge.push_back( position + 0.5f );
            return true;
        }

        return false;
    }